

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int parse_spec(pmtr_t *cfg,UT_string *em,char *spec,in_addr_t *addr,int *port,char **iface)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  hostent *phVar6;
  size_t sVar7;
  int *piVar8;
  int iVar9;
  
  if (iface != (char **)0x0) {
    *iface = (char *)0x0;
  }
  iVar2 = strncmp(spec,"udp://",6);
  iVar9 = -1;
  bVar1 = true;
  if ((iVar2 == 0) && (pcVar4 = strrchr(spec,0x3a), pcVar4 != (char *)0x0)) {
    uVar3 = atoi(pcVar4 + 1);
    *port = uVar3;
    if (uVar3 < 0x10000) {
      pcVar5 = strrchr(spec,0x40);
      if (pcVar5 != (char *)0x0 && iface != (char **)0x0) {
        *iface = pcVar5 + 1;
      }
      if (cfg->test_only != 0) {
        return 0;
      }
      pcVar5 = spec + 6;
      *pcVar4 = '\0';
      phVar6 = gethostbyname(pcVar5);
      sVar7 = strlen(pcVar5);
      *pcVar4 = ':';
      if (phVar6 == (hostent *)0x0) {
        piVar8 = __h_errno_location();
        pcVar4 = hstrerror(*piVar8);
        bVar1 = false;
        utstring_printf(em,"lookup [%.*s]: %s",sVar7 & 0xffffffff,pcVar5,pcVar4);
        iVar9 = -2;
      }
      else {
        *addr = *(in_addr_t *)*phVar6->h_addr_list;
        bVar1 = false;
        iVar9 = 0;
      }
    }
  }
  if (bVar1) {
    utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  }
  return iVar9;
}

Assistant:

static int parse_spec(pmtr_t *cfg, UT_string *em, char *spec, 
                      in_addr_t *addr, int *port, char **iface) {
  char *proto = spec, *colon, *host, *at;
  struct hostent *h;
  int hlen, rc=-1;
  if (iface) *iface = NULL;

  if (strncmp(proto, "udp://", 6)) goto done;
  host = &spec[6];

  if ( !(colon = strrchr(spec, ':'))) goto done;
  *port = atoi(colon+1);
  if ((*port < 0) || (*port > 65535)) goto done;

  if ( (at = strrchr(spec, '@')) != NULL) { // trailing @eth2
    if (iface) *iface = at+1;
  }

  /* stop here if syntax checking */
  if (cfg->test_only) return 0; 

  /* dns lookup. */
  *colon = '\0'; 
  h = gethostbyname(host); 
  hlen = strlen(host);
  *colon = ':';
  if (!h) {
    utstring_printf(em, "lookup [%.*s]: %s", hlen, host, hstrerror(h_errno));
    rc = -2;
    goto done;
  }

  *addr = ((struct in_addr*)h->h_addr)->s_addr;
  rc = 0; /* success */

 done:
  if (rc == -1) utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  return rc;
}